

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<unsigned_short,(unsigned_char)8>,false>
          (Thread *this)

{
  ushort uVar1;
  ushort uVar2;
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  unsigned_short *puVar3;
  uint *puVar4;
  byte local_41;
  undefined1 auStack_40 [6];
  u8 laneidx;
  u8 i;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  Simd<unsigned_short,_(unsigned_char)__b_> lhs;
  Simd<unsigned_short,_(unsigned_char)__b_> rhs;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  for (local_41 = 0; local_41 < 4; local_41 = local_41 + 1) {
    puVar3 = Simd<unsigned_short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<unsigned_short,_(unsigned_char)__b_> *)(result.v + 2),local_41 + 4);
    uVar1 = *puVar3;
    puVar3 = Simd<unsigned_short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<unsigned_short,_(unsigned_char)__b_> *)(lhs.v + 4),local_41 + 4);
    uVar2 = *puVar3;
    puVar4 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<unsigned_int,_(unsigned_char)__x04_> *)auStack_40,local_41);
    *puVar4 = (uint)uVar1 * (uint)uVar2;
  }
  value.v[2] = result.v[0];
  value.v[3] = result.v[1];
  value.v[0] = auStack_40._0_4_;
  value.v[1] = stack0xffffffffffffffc4;
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}